

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hw_identifier_it_test.cpp
# Opt level: O0

void license::test::generate_and_verify_license
               (LCC_API_HW_IDENTIFICATION_STRATEGY strategy,string *lic_fname)

{
  pointer *this;
  unit_test_log_t *puVar1;
  bool bVar2;
  basic_wrap_stringstream<char> *pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  ostream *poVar5;
  lazy_ostream *plVar6;
  LCC_API_HW_IDENTIFICATION_STRATEGY strategy_00;
  undefined1 local_3061;
  basic_cstring<const_char> local_3060;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_3050;
  basic_cstring<const_char> local_3028;
  basic_cstring<const_char> local_3018;
  undefined1 local_3001;
  basic_cstring<const_char> local_3000;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_2ff0;
  basic_cstring<const_char> local_2fc8;
  basic_cstring<const_char> local_2fb8;
  undefined4 local_2fa4;
  basic_cstring<const_char> local_2fa0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_2f90;
  basic_cstring<const_char> local_2f68;
  basic_cstring<const_char> local_2f58;
  LCC_EVENT_TYPE local_2f44;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_2f40;
  LCC_EVENT_TYPE result;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2f38;
  undefined1 local_2f2c [8];
  LicenseLocation location;
  LicenseInfo license;
  string licLocation;
  basic_cstring<const_char> local_418;
  basic_cstring<const_char> local_408;
  allocator local_3f1;
  value_type local_3f0;
  undefined1 local_3d0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraArgs;
  basic_cstring<const_char> local_220;
  basic_cstring<const_char> local_210;
  undefined1 local_200 [8];
  string identifier_out;
  basic_wrap_stringstream<char> local_1d0;
  basic_cstring<const_char> local_38;
  basic_cstring<const_char> local_28;
  string *local_18;
  string *lic_fname_local;
  LCC_API_HW_IDENTIFICATION_STRATEGY strategy_local;
  
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_18 = lic_fname;
  lic_fname_local._4_4_ = strategy;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/functional/hw_identifier_it_test.cpp"
             ,0x7c);
  memset(&local_1d0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_1d0);
  pbVar3 = boost::basic_wrap_stringstream<char>::ref(&local_1d0);
  pbVar3 = boost::operator<<(pbVar3,(char (*) [16])"Before generate");
  pbVar4 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar3);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_38,pbVar4);
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_28,0x20,&local_38);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_1d0);
  hw_identifier::HwIdentifierFacade::generate_user_pc_signature_abi_cxx11_
            ((string *)local_200,(HwIdentifierFacade *)(ulong)(uint)lic_fname_local._4_4_,
             strategy_00);
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_210,
             "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/functional/hw_identifier_it_test.cpp"
             ,0x7c);
  this = &extraArgs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
  memset(this,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)this);
  pbVar3 = boost::basic_wrap_stringstream<char>::ref
                     ((basic_wrap_stringstream<char> *)
                      &extraArgs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pbVar3 = boost::operator<<(pbVar3,(char (*) [25])"After generate signature");
  pbVar4 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar3);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_220,pbVar4);
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_210,0x22,&local_220);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)
             &extraArgs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  poVar5 = std::operator<<((ostream *)std::cout,"Identifier:");
  poVar5 = std::operator<<(poVar5,(string *)local_200);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_3d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3f0,"-s",&local_3f1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_3d0,&local_3f0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_3d0,(value_type *)local_200);
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_408,
             "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/functional/hw_identifier_it_test.cpp"
             ,0x7c);
  pbVar3 = (basic_wrap_stringstream<char> *)((long)&licLocation.field_2 + 8);
  memset(pbVar3,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(pbVar3);
  pbVar3 = boost::basic_wrap_stringstream<char>::ref
                     ((basic_wrap_stringstream<char> *)((long)&licLocation.field_2 + 8));
  pbVar3 = boost::operator<<(pbVar3,(char (*) [24])"Before generate license");
  pbVar4 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar3);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_418,pbVar4);
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_408,0x27,&local_418);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)((long)&licLocation.field_2 + 8));
  generate_license((string *)(license.proprietary_data + 0x10),local_18,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_3d0);
  memset(local_2f2c,0,0x1004);
  local_2f38._M_current = (char *)std::__cxx11::string::begin();
  _Stack_2f40._M_current = (char *)std::__cxx11::string::end();
  std::copy<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char*>
            (local_2f38,_Stack_2f40,local_2f2c + 4);
  local_2f44 = acquire_license((CallerInformations *)0x0,(LicenseLocation *)local_2f2c,
                               (LicenseInfo_conflict *)(location.licenseData + 0xff8));
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2f58,
               "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/functional/hw_identifier_it_test.cpp"
               ,0x7c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2f68);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_2f58,0x2d,&local_2f68);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_2f90,plVar6,(char (*) [1])"");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2fa0,
               "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/functional/hw_identifier_it_test.cpp"
               ,0x7c);
    local_2fa4 = 0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,LCC_EVENT_TYPE,LCC_EVENT_TYPE>
              (&local_2f90,&local_2fa0,0x2d,1,2,&local_2f44,"result",&local_2fa4,"LICENSE_OK");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_2f90);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2fb8,
               "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/functional/hw_identifier_it_test.cpp"
               ,0x7c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2fc8);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_2fb8,0x2e,&local_2fc8);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_2ff0,plVar6,(char (*) [1])"");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3000,
               "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/functional/hw_identifier_it_test.cpp"
               ,0x7c);
    local_3001 = 0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (&local_2ff0,&local_3000,0x2e,1,2,license.expiry_date + 8,"license.has_expiry",
               &local_3001,"false");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_2ff0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3018,
               "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/functional/hw_identifier_it_test.cpp"
               ,0x7c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_3028);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_3018,0x2f,&local_3028);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_3050,plVar6,(char (*) [1])"");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3060,
               "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/functional/hw_identifier_it_test.cpp"
               ,0x7c);
    local_3061 = 1;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (&local_3050,&local_3060,0x2f,1,2,license.expiry_date + 9,"license.linked_to_pc",
               &local_3061,"true");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_3050);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::string::~string((string *)(license.proprietary_data + 0x10));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_3d0);
  std::__cxx11::string::~string((string *)local_200);
  return;
}

Assistant:

static void generate_and_verify_license(LCC_API_HW_IDENTIFICATION_STRATEGY strategy, const string& lic_fname) {
	BOOST_TEST_CHECKPOINT("Before generate");
	const string identifier_out = HwIdentifierFacade::generate_user_pc_signature(strategy);
	BOOST_TEST_CHECKPOINT("After generate signature");
	cout << "Identifier:" << identifier_out << endl;
	vector<string> extraArgs;
	extraArgs.push_back("-s");
	extraArgs.push_back(identifier_out);
	BOOST_TEST_CHECKPOINT("Before generate license");
	const string licLocation = generate_license(lic_fname, extraArgs);
	LicenseInfo license;
	LicenseLocation location = {LICENSE_PATH};
	std::copy(licLocation.begin(), licLocation.end(), location.licenseData);
	const LCC_EVENT_TYPE result = acquire_license(nullptr, &location, &license);
	BOOST_CHECK_EQUAL(result, LICENSE_OK);
	BOOST_CHECK_EQUAL(license.has_expiry, false);
	BOOST_CHECK_EQUAL(license.linked_to_pc, true);
}